

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf64.c
# Opt level: O0

void elf64_symbols(GlobalVars *gv,Elf64_Ehdr *ehdr,ObjectUnit *ou,Elf64_Shdr *shdr)

{
  byte bVar1;
  long lVar2;
  uint8_t flags;
  uint16_t uVar3;
  uint32_t uVar4;
  uint shtype;
  uint64_t uVar5;
  uint64_t uVar6;
  GlobalVars *pGVar7;
  char *pcVar8;
  long in_RDX;
  long in_RSI;
  char *symname;
  Elf64_Sym *elfsym;
  char *strtab;
  int nsyms;
  unsigned_long entsize;
  uint8_t *data;
  LinkFile *lf;
  bool be;
  uint in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  bool in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff30;
  int idx;
  Elf64_Ehdr *in_stack_ffffffffffffff38;
  LinkFile *in_stack_ffffffffffffff40;
  ObjectUnit *in_stack_ffffffffffffff60;
  GlobalVars *gv_00;
  long lVar9;
  long value;
  uint32_t size;
  int local_4c;
  long local_40;
  
  idx = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  lVar2 = *(long *)(in_RDX + 0x10);
  uVar5 = read64(in_stack_ffffffffffffff14,
                 (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_40 = in_RSI + uVar5;
  uVar5 = read64(in_stack_ffffffffffffff14,
                 (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  uVar6 = read64(in_stack_ffffffffffffff14,
                 (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_4c = (int)(uVar6 / uVar5);
  read32(in_stack_ffffffffffffff14,
         (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  pGVar7 = (GlobalVars *)elf64_strtab(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,idx);
  lVar9 = lVar2;
  value = local_40;
  read64(in_stack_ffffffffffffff14,
         (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  elf_check_offset((LinkFile *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18,
                   (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  while (local_4c = local_4c + -1, 0 < local_4c) {
    local_40 = uVar5 + local_40;
    gv_00 = pGVar7;
    uVar4 = read32(in_stack_ffffffffffffff14,
                   (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    pcVar8 = (char *)((long)&(gv_00->libpaths).first + (ulong)uVar4);
    if ((pcVar8 < *(char **)(lVar2 + 0x28)) ||
       ((char *)(*(long *)(lVar2 + 0x28) + *(long *)(lVar2 + 0x30)) < pcVar8)) {
      in_stack_ffffffffffffff60 = *(ObjectUnit **)(lVar2 + 0x10);
      uVar4 = read32(in_stack_ffffffffffffff14,
                     (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      error(0x7f,in_stack_ffffffffffffff60,(ulong)uVar4,*(undefined8 *)(lVar2 + 0x20));
    }
    size = (uint32_t)pcVar8;
    read32(in_stack_ffffffffffffff14,
           (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    uVar3 = read16(in_stack_ffffffffffffff14,
                   (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    shtype = (uint)uVar3;
    uVar4 = read32(in_stack_ffffffffffffff14,
                   (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    bVar1 = *(byte *)(local_40 + 4);
    flags = (uint8_t)((int)(uint)*(byte *)(local_40 + 4) >> 4);
    pcVar8 = (char *)read64(in_stack_ffffffffffffff14,
                            (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    read64(in_stack_ffffffffffffff14,
           (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    in_stack_ffffffffffffff08 = (uint)(bVar1 & 0xf);
    elf_add_symbol(gv_00,in_stack_ffffffffffffff60,pcVar8,flags,uVar4,shtype,(uint8_t)in_RSI,
                   (uint8_t)lVar9,value,size);
  }
  return;
}

Assistant:

static void elf64_symbols(struct GlobalVars *gv,struct Elf64_Ehdr *ehdr,
                   struct ObjectUnit *ou,struct Elf64_Shdr *shdr)
/* convert ELF symbol definitions into internal format */
{
  bool be = (ehdr->e_ident[EI_DATA] == ELFDATA2MSB);
  struct LinkFile *lf = ou->lnkfile;
  uint8_t *data = (uint8_t *)ehdr + read64(be,shdr->sh_offset);
  unsigned long entsize = read64(be,shdr->sh_entsize);
  int nsyms = (int)(read64(be,shdr->sh_size) / (uint64_t)entsize);
  char *strtab = elf64_strtab(lf,ehdr,read32(be,shdr->sh_link));

  elf_check_offset(lf,"symbol",data,read64(be,shdr->sh_size));

  /* read ELF xdef symbols and convert to internal format */
  while (--nsyms > 0) {
    struct Elf64_Sym *elfsym;
    char *symname;

    elfsym = (struct Elf64_Sym *)(data += entsize);
    symname = strtab + read32(be,elfsym->st_name);
    if (symname<(char *)lf->data || symname>(char *)lf->data+lf->length)
      error(127,lf->pathname,read32(be,elfsym->st_name),lf->objname);

    elf_add_symbol(gv,ou,symname,
                   (read32(be,shdr->sh_type)==SHT_DYNSYM) ? SYMF_SHLIB : 0,
                   read16(be,elfsym->st_shndx),
                   read32(be,shdr->sh_type),
                   ELF64_ST_TYPE(*elfsym->st_info),
                   ELF64_ST_BIND(*elfsym->st_info),
                   read64(be,elfsym->st_value),
                   read64(be,elfsym->st_size));
  }
}